

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.c
# Opt level: O3

gdImagePtr read_png(char *filename)

{
  FILE *__stream;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Can\'t read png image %s\n",filename);
  }
  else {
    puts("No PNG support. Cannot read image.");
    fclose(__stream);
  }
  return (gdImagePtr)0x0;
}

Assistant:

gdImagePtr read_png(const char *filename)
{
	FILE * fp;
	gdImagePtr im;

	fp = fopen(filename, "rb");
	if (!fp) {
		fprintf(stderr, "Can't read png image %s\n", filename);
		return NULL;
	}
#ifdef HAVE_LIBPNG
	im = gdImageCreateFromPng(fp);
#else
	im = NULL;
	printf("No PNG support. Cannot read image.\n");
#endif
	fclose(fp);
	return im;
}